

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.h
# Opt level: O3

uint32_t __thiscall
spvtools::opt::CopyPropagateArrays::MemoryObject::GetPointerTypeId
          (MemoryObject *this,CopyPropagateArrays *pass)

{
  IRContext *this_00;
  DefUseManager *this_01;
  TypeManager *this_02;
  uint32_t index;
  short sVar1;
  uint32_t uVar2;
  StorageClass storage_class;
  Instruction *pIVar3;
  uint uVar4;
  IRContext *this_03;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  pIVar3 = this->variable_inst_;
  this_00 = pIVar3->context_;
  sVar1 = (short)this_00->valid_analyses_;
  this_03 = this_00;
  if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_00);
    pIVar3 = this->variable_inst_;
    this_03 = pIVar3->context_;
    sVar1 = (short)this_03->valid_analyses_;
  }
  this_01 = (this_00->def_use_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  if (-1 < sVar1) {
    IRContext::BuildTypeManager(this_03);
    pIVar3 = this->variable_inst_;
  }
  this_02 = (this_03->type_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  uVar2 = 0;
  if (pIVar3->has_type_id_ == true) {
    uVar2 = Instruction::GetSingleWordOperand(pIVar3,0);
  }
  pIVar3 = analysis::DefUseManager::GetDef(this_01,uVar2);
  uVar4 = (pIVar3->has_result_id_ & 1) + 1;
  if (pIVar3->has_type_id_ == false) {
    uVar4 = (uint)pIVar3->has_result_id_;
  }
  uVar2 = Instruction::GetSingleWordOperand(pIVar3,uVar4 + 1);
  GetAccessIds(&local_48,this);
  uVar2 = GetMemberTypeId(pass,uVar2,&local_48);
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  index = (pIVar3->has_result_id_ & 1) + 1;
  if (pIVar3->has_type_id_ == false) {
    index = (uint)pIVar3->has_result_id_;
  }
  storage_class = Instruction::GetSingleWordOperand(pIVar3,index);
  uVar2 = analysis::TypeManager::FindPointerToType(this_02,uVar2,storage_class);
  return uVar2;
}

Assistant:

uint32_t GetPointerTypeId(const CopyPropagateArrays* pass) const {
      analysis::DefUseManager* def_use_mgr =
          GetVariable()->context()->get_def_use_mgr();
      analysis::TypeManager* type_mgr =
          GetVariable()->context()->get_type_mgr();

      Instruction* var_pointer_inst =
          def_use_mgr->GetDef(GetVariable()->type_id());

      uint32_t member_type_id = pass->GetMemberTypeId(
          var_pointer_inst->GetSingleWordInOperand(1), GetAccessIds());

      uint32_t member_pointer_type_id = type_mgr->FindPointerToType(
          member_type_id, static_cast<spv::StorageClass>(
                              var_pointer_inst->GetSingleWordInOperand(0)));
      return member_pointer_type_id;
    }